

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O1

void __thiscall
cinatra::coro_http_server::set_static_res_dir<>
          (coro_http_server *this,string_view uri_suffix,string *file_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  char cVar4;
  byte bVar5;
  size_type sVar6;
  size_type sVar7;
  path *ppVar8;
  void *pvVar9;
  path *ppVar10;
  pointer this_00;
  bool bVar11;
  path router_path;
  recursive_directory_iterator __end2;
  string uri;
  error_code ec;
  path local_1a8;
  string_type local_180;
  path local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  path local_118;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  string local_d8;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  pointer local_90;
  recursive_directory_iterator local_88;
  recursive_directory_iterator local_78;
  error_code local_68;
  path local_58;
  
  local_e8._M_str = uri_suffix._M_str;
  local_e8._M_len = uri_suffix._M_len;
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (file_path,"..",0,2);
  bVar5 = 1;
  bVar11 = true;
  if (sVar6 == 0xffffffffffffffff) {
    sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_e8,"..",0,2);
    bVar11 = sVar7 != 0xffffffffffffffff;
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_160,file_path,auto_format);
  cVar4 = std::filesystem::__cxx11::path::has_root_path();
  if (cVar4 == '\0') {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_58,&local_e8,auto_format);
    bVar5 = std::filesystem::__cxx11::path::has_root_path();
    bVar5 = bVar11 | bVar5;
    std::filesystem::__cxx11::path::~path(&local_58);
  }
  std::filesystem::__cxx11::path::~path(&local_160);
  if (bVar5 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"invalid file path: ",0x13);
    cerr_logger_t::operator<<((cerr_logger_t *)&local_160,file_path);
    cerr_logger_t::~cerr_logger_t((cerr_logger_t *)&local_160);
    exit(1);
  }
  if (local_e8._M_len != 0) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_160,&local_e8,auto_format);
    paVar1 = &local_1a8._M_pathname.field_2;
    local_1a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,local_160._M_pathname._M_dataplus._M_p,
               local_160._M_pathname._M_dataplus._M_p + local_160._M_pathname._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->static_dir_router_path_,&local_1a8._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8._M_pathname._M_dataplus._M_p,
                      local_1a8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_160);
  }
  if (file_path->_M_string_length == 0) {
    std::filesystem::current_path_abi_cxx11_();
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,local_118._M_pathname._M_dataplus._M_p,
               local_118._M_pathname._M_dataplus._M_p + local_118._M_pathname._M_string_length);
    std::filesystem::__cxx11::path::path(&local_1a8,&local_180,auto_format);
    std::filesystem::absolute(&local_160);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,local_160._M_pathname._M_dataplus._M_p,
               local_160._M_pathname._M_dataplus._M_p + local_160._M_pathname._M_string_length);
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_1a8,file_path,auto_format);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_pathname._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00144027:
      std::filesystem::__cxx11::path::path(&local_160);
    }
    else {
      ppVar8 = &local_1a8;
      if ((~local_1a8._M_cmpts & 3) != 0) {
        if (((local_1a8._32_8_ & 3) == 0) &&
           ((local_1a8._M_pathname._M_dataplus._M_p + -1)[local_1a8._M_pathname._M_string_length] !=
            '/')) {
          if ((local_1a8._32_8_ & 3) == 0) {
            ppVar8 = (path *)std::filesystem::__cxx11::path::_List::end();
          }
          else {
            ppVar8 = (path *)0x0;
          }
          ppVar10 = (path *)&ppVar8[-2]._M_cmpts;
          if ((local_1a8._32_8_ & 3) != 0) {
            ppVar10 = ppVar8;
          }
          ppVar8 = &local_1a8;
          if ((local_1a8._32_8_ & 3) == 0) {
            ppVar8 = ppVar10;
          }
          if ((~*(uint *)&ppVar8->_M_cmpts & 3) == 0) {
            ppVar8 = &local_1a8;
            if ((local_1a8._32_8_ & 3) == 0) {
              ppVar8 = ppVar10;
            }
            goto LAB_00144018;
          }
        }
        goto LAB_00144027;
      }
LAB_00144018:
      std::filesystem::__cxx11::path::path(&local_160,ppVar8);
    }
    paVar1 = &local_118._M_pathname.field_2;
    local_118._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,local_160._M_pathname._M_dataplus._M_p,
               local_160._M_pathname._M_dataplus._M_p + local_160._M_pathname._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (file_path,&local_118._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_pathname._M_dataplus._M_p,
                      CONCAT71(local_118._M_pathname.field_2._M_allocated_capacity._1_7_,
                               local_118._M_pathname.field_2._M_local_buf[0]) + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_160);
    std::filesystem::__cxx11::path::~path(&local_1a8);
    if (file_path->_M_string_length != 0) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_160,file_path,auto_format);
      paVar1 = &local_1a8._M_pathname.field_2;
      local_1a8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,local_160._M_pathname._M_dataplus._M_p,
                 local_160._M_pathname._M_dataplus._M_p + local_160._M_pathname._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->static_dir_,&local_1a8._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_pathname._M_dataplus._M_p,
                        local_1a8._M_pathname.field_2._M_allocated_capacity + 1);
      }
      ppVar8 = &local_160;
      goto LAB_001441cc;
    }
    std::filesystem::current_path_abi_cxx11_();
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,local_118._M_pathname._M_dataplus._M_p,
               local_118._M_pathname._M_dataplus._M_p + local_118._M_pathname._M_string_length);
    std::filesystem::__cxx11::path::path(&local_1a8,&local_180,auto_format);
    std::filesystem::absolute(&local_160);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,local_160._M_pathname._M_dataplus._M_p,
               local_160._M_pathname._M_dataplus._M_p + local_160._M_pathname._M_string_length);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->static_dir_,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_160);
  std::filesystem::__cxx11::path::~path(&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  ppVar8 = &local_118;
LAB_001441cc:
  std::filesystem::__cxx11::path::~path(ppVar8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->files_,
                    (this->files_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_68._M_value = 0;
  local_68._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_160,&this->static_dir_,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&local_1a8,&local_160,none,&local_68);
  std::filesystem::__cxx11::path::~path(&local_160);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_pathname._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_1a8._M_pathname._M_string_length + 8) =
           *(_Atomic_word *)(local_1a8._M_pathname._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_1a8._M_pathname._M_string_length + 8) =
           *(_Atomic_word *)(local_1a8._M_pathname._M_string_length + 8) + 1;
    }
  }
  local_118._M_pathname._M_dataplus._M_p = local_1a8._M_pathname._M_dataplus._M_p;
  local_118._M_pathname._M_string_length = local_1a8._M_pathname._M_string_length;
  local_88._M_dirs._M_ptr = (element_type *)0x0;
  local_88._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_88);
  local_78._M_dirs._M_ptr = (element_type *)local_1a8._M_pathname._M_dataplus._M_p;
  local_78._M_dirs._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_pathname._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_pathname._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_1a8._M_pathname._M_string_length + 8) =
           *(_Atomic_word *)(local_1a8._M_pathname._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_1a8._M_pathname._M_string_length + 8) =
           *(_Atomic_word *)(local_1a8._M_pathname._M_string_length + 8) + 1;
    }
  }
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_78);
  paVar1 = &local_160._M_pathname.field_2;
  while (local_118._M_pathname._M_string_length != local_138._M_string_length) {
    ppVar8 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                               ((recursive_directory_iterator *)&local_118);
    if (local_68._M_value == 0) {
      cVar4 = *(char *)&ppVar8[1]._M_pathname._M_dataplus._M_p;
      if ((cVar4 == '\x03') || (cVar4 == '\0')) {
        cVar4 = std::filesystem::status(ppVar8);
      }
      if (cVar4 != '\x02') {
        pcVar2 = (ppVar8->_M_pathname)._M_dataplus._M_p;
        local_160._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,pcVar2,pcVar2 + (ppVar8->_M_pathname)._M_string_length);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->files_,&local_160._M_pathname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_160._M_pathname._M_dataplus._M_p,
                          local_160._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&local_118);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_138);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_118);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_1a8);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_160,&this->static_dir_router_path_,auto_format);
  local_118._M_pathname._M_dataplus._M_p = (pointer)&local_118._M_pathname.field_2;
  local_118._M_pathname._M_string_length = 0;
  local_118._M_pathname.field_2._M_local_buf[0] = '\0';
  this_00 = (this->files_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (this->files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_90) {
    do {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_180,this_00,(this->static_dir_)._M_string_length,0xffffffffffffffff);
      std::filesystem::__cxx11::path::path(&local_1a8,&local_180,auto_format);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,local_1a8._M_pathname._M_dataplus._M_p,
                 local_1a8._M_pathname._M_dataplus._M_p +
                 (long)(_func_int ***)local_1a8._M_pathname._M_string_length);
      std::filesystem::__cxx11::path::~path(&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      _Var3._M_p = local_138._M_dataplus._M_p;
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (pvVar9 = memchr(local_138._M_dataplus._M_p,0x5c,local_138._M_string_length),
         (long)pvVar9 - (long)_Var3._M_p != -1 && pvVar9 != (void *)0x0)) {
        local_1a8._M_pathname._M_dataplus._M_p = (pointer)&local_1a8._M_pathname.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"\\","");
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"/","");
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_pathname._M_string_length
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          for (sVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 (&local_138,local_1a8._M_pathname._M_dataplus._M_p,0,
                                  local_1a8._M_pathname._M_string_length);
              sVar6 != 0xffffffffffffffff;
              sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                (&local_138,local_1a8._M_pathname._M_dataplus._M_p,
                                 sVar6 + local_180._M_string_length,
                                 local_1a8._M_pathname._M_string_length)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_138,sVar6,local_1a8._M_pathname._M_string_length,
                       local_180._M_dataplus._M_p,local_180._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_pathname._M_dataplus._M_p != &local_1a8._M_pathname.field_2) {
          operator_delete(local_1a8._M_pathname._M_dataplus._M_p,
                          local_1a8._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      if ((this->static_dir_router_path_)._M_string_length == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_118._M_pathname,&local_138);
      }
      else {
        std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
                  (&local_1a8,(char (*) [2])0x18a47e,auto_format);
        std::filesystem::__cxx11::path::_M_append
                  (&local_1a8,(this->static_dir_router_path_)._M_string_length,
                   (this->static_dir_router_path_)._M_dataplus._M_p);
        std::filesystem::__cxx11::path::_M_concat
                  (&local_1a8,local_138._M_string_length,local_138._M_dataplus._M_p);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,local_1a8._M_pathname._M_dataplus._M_p,
                   local_1a8._M_pathname._M_dataplus._M_p +
                   (long)(_func_int ***)local_1a8._M_pathname._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_118._M_pathname,&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path(&local_1a8);
      }
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_118._M_pathname._M_dataplus._M_p,
                 local_118._M_pathname._M_dataplus._M_p + local_118._M_pathname._M_string_length);
      local_b0._M_p = (pointer)&local_a0;
      pcVar2 = (this_00->_M_dataplus)._M_p;
      local_b8 = (undefined1  [8])this;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + this_00->_M_string_length);
      set_http_handler<(cinatra::http_method)1,cinatra::coro_http_server::set_static_res_dir<>(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string)::_lambda(cinatra::coro_http_request&,cinatra::coro_http_response&)_1_>
                (this,&local_d8,(anon_class_40_2_16f3dfdb *)local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_p != &local_a0) {
        operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_pathname._M_dataplus._M_p != &local_118._M_pathname.field_2) {
    operator_delete(local_118._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_118._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_118._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_160);
  return;
}

Assistant:

void set_static_res_dir(std::string_view uri_suffix = "",
                          std::string file_path = "www", Aspects &&...aspects) {
    bool has_double_dot = (file_path.find("..") != std::string::npos) ||
                          (uri_suffix.find("..") != std::string::npos);
    if (std::filesystem::path(file_path).has_root_path() ||
        std::filesystem::path(uri_suffix).has_root_path() || has_double_dot) {
      CINATRA_LOG_ERROR << "invalid file path: " << file_path;
      std::exit(1);
    }

    if (!uri_suffix.empty()) {
      static_dir_router_path_ =
          std::filesystem::path(uri_suffix).make_preferred().string();
    }

    if (!file_path.empty()) {
      file_path = std::filesystem::path(file_path).filename().string();
      if (file_path.empty()) {
        static_dir_ = fs::absolute(fs::current_path().string()).string();
      }
      else {
        static_dir_ =
            std::filesystem::path(file_path).make_preferred().string();
      }
    }
    else {
      static_dir_ = fs::absolute(fs::current_path().string()).string();
    }

    files_.clear();
    std::error_code ec;
    for (const auto &file :
         std::filesystem::recursive_directory_iterator(static_dir_, ec)) {
      if (ec) {
        continue;
      }
      if (!file.is_directory()) {
        files_.push_back(file.path().string());
      }
    }

    std::filesystem::path router_path =
        std::filesystem::path(static_dir_router_path_);

    std::string uri;
    for (auto &file : files_) {
      auto relative_path =
          std::filesystem::path(file.substr(static_dir_.length())).string();
      if (size_t pos = relative_path.find('\\') != std::string::npos) {
        replace_all(relative_path, "\\", "/");
      }

      if (static_dir_router_path_.empty()) {
        uri = relative_path;
      }
      else {
        uri = fs::path("/")
                  .append(static_dir_router_path_)
                  .concat(relative_path)
                  .string();
      }

      set_http_handler<cinatra::GET>(
          uri,
          [this, file_name = file](
              coro_http_request &req,
              coro_http_response &resp) -> async_simple::coro::Lazy<void> {
            std::string_view extension = get_extension(file_name);
            std::string_view mime = get_mime_type(extension);
            auto range_str = req.get_header_value("Range");

            if (auto it = static_file_cache_.find(file_name);
                it != static_file_cache_.end()) {
              auto range_header = build_range_header(
                  mime, file_name, std::to_string(fs::file_size(file_name)));
              resp.set_delay(true);
              std::string &body = it->second;
              std::array<asio::const_buffer, 2> arr{asio::buffer(range_header),
                                                    asio::buffer(body)};
              co_await req.get_conn()->async_write(arr);
              co_return;
            }

            std::string content;
            detail::resize(content, chunked_size_);

            coro_io::coro_file in_file{};
            in_file.open(file_name, std::ios::in);
            if (!in_file.is_open()) {
              resp.set_status_and_content(status_type::not_found,
                                          file_name + "not found");
              co_return;
            }

            size_t file_size = fs::file_size(file_name);

            if (format_type_ == file_resp_format_type::chunked &&
                range_str.empty()) {
              resp.set_format_type(format_type::chunked);
              bool ok;
              if (ok = co_await resp.get_conn()->begin_chunked(); !ok) {
                co_return;
              }

              while (true) {
                auto [ec, size] =
                    co_await in_file.async_read(content.data(), content.size());
                if (ec) {
                  resp.set_status(status_type::no_content);
                  co_await resp.get_conn()->reply();
                  co_return;
                }

                bool r = co_await resp.get_conn()->write_chunked(
                    std::string_view(content.data(), size));
                if (!r) {
                  co_return;
                }

                if (in_file.eof()) {
                  co_await resp.get_conn()->end_chunked();
                  break;
                }
              }
            }
            else {
              auto pos = range_str.find('=');
              if (pos != std::string_view::npos) {
                range_str = range_str.substr(pos + 1);
                bool is_valid = true;
                auto ranges =
                    parse_ranges(range_str, fs::file_size(file_name), is_valid);
                if (!is_valid) {
                  resp.set_status(status_type::range_not_satisfiable);
                  co_return;
                }

                assert(!ranges.empty());

                if (ranges.size() == 1) {
                  // single part
                  auto [start, end] = ranges[0];
                  in_file.seek(start, std::ios::beg);
                  size_t part_size = end + 1 - start;
                  int status = (part_size == file_size) ? 200 : 206;
                  std::string content_range = "Content-Range: bytes ";
                  content_range.append(std::to_string(start))
                      .append("-")
                      .append(std::to_string(end))
                      .append("/")
                      .append(std::to_string(file_size))
                      .append(CRCF);
                  auto range_header = build_range_header(
                      mime, file_name, std::to_string(part_size), status,
                      content_range);
                  resp.set_delay(true);
                  bool r = co_await req.get_conn()->write_data(range_header);
                  if (!r) {
                    co_return;
                  }

                  co_await send_single_part(in_file, content, req, resp,
                                            part_size);
                }
                else {
                  // multiple ranges
                  resp.set_delay(true);
                  std::string file_size_str = std::to_string(file_size);
                  size_t content_len = 0;
                  std::vector<std::string> multi_heads = build_part_heads(
                      ranges, mime, file_size_str, content_len);
                  auto range_header = build_multiple_range_header(content_len);
                  bool r = co_await req.get_conn()->write_data(range_header);
                  if (!r) {
                    co_return;
                  }

                  for (int i = 0; i < ranges.size(); i++) {
                    std::string &part_header = multi_heads[i];
                    r = co_await req.get_conn()->write_data(part_header);
                    if (!r) {
                      co_return;
                    }

                    auto [start, end] = ranges[i];
                    bool ok = in_file.seek(start, std::ios::beg);
                    if (!ok) {
                      resp.set_status_and_content(status_type::bad_request,
                                                  "invalid range");
                      co_await resp.get_conn()->reply();
                      co_return;
                    }
                    size_t part_size = end + 1 - start;

                    std::string_view more = CRCF;
                    if (i == ranges.size() - 1) {
                      more = MULTIPART_END;
                    }
                    r = co_await send_single_part(in_file, content, req, resp,
                                                  part_size, more);
                    if (!r) {
                      co_return;
                    }
                  }
                }
                co_return;
              }

              auto range_header = build_range_header(mime, file_name,
                                                     std::to_string(file_size));
              resp.set_delay(true);
              bool r = co_await req.get_conn()->write_data(range_header);
              if (!r) {
                co_return;
              }

              while (true) {
                auto [ec, size] =
                    co_await in_file.async_read(content.data(), content.size());
                if (ec) {
                  resp.set_status(status_type::no_content);
                  co_await resp.get_conn()->reply();
                  co_return;
                }

                r = co_await req.get_conn()->write_data(
                    std::string_view(content.data(), size));
                if (!r) {
                  co_return;
                }

                if (in_file.eof()) {
                  break;
                }
              }
            }
          },
          std::forward<Aspects>(aspects)...);
    }
  }